

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
Belief::InnerProduct
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Belief *this,VectorSet *v
          ,vector<bool,_std::allocator<bool>_> *mask)

{
  undefined1 auVar1 [16];
  pointer pdVar2;
  const_reference cVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong __n;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  allocator_type local_31;
  value_type_conflict3 local_30;
  
  local_30 = -1.79769313486232e+308;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,v->size1_,&local_30,&local_31);
  for (uVar6 = 0; __n = (ulong)uVar6, v->size1_ != __n; uVar6 = uVar6 + 1) {
    cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,__n);
    if (cVar3) {
      pdVar2 = (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      auVar7 = ZEXT816(0) << 0x40;
      uVar4 = 0;
      while( true ) {
        uVar5 = (ulong)uVar4;
        if ((long)(this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 == uVar5) break;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = pdVar2[uVar5];
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (v->data_).data_[v->size2_ * __n + uVar5];
        auVar7 = vfmadd231sd_fma(auVar7,auVar8,auVar1);
        uVar4 = uVar4 + 1;
      }
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[__n] = auVar7._0_8_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> Belief::InnerProduct(const VectorSet &v,
                                    const vector<bool> &mask) const
{
    vector<double> values(v.size1(),-DBL_MAX);

    double x;
    for(unsigned int k=0;k!=v.size1();++k)
    {
        if(mask[k])
        {
            x=0;
            for(unsigned int s=0; s!=_m_b.size(); ++s)
                x+=_m_b[s]*v(k,s);
            values[k]=x;
        }
    }

    return(values);
}